

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Scanner::visitFunction(Scanner *this,Function *curr)

{
  bool bVar1;
  mapped_type *this_00;
  mapped_type *pmVar2;
  reference __in;
  type *__k;
  type *ptVar3;
  mapped_type *this_01;
  bool local_79;
  type *count;
  type *global_1;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_60;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *__range2;
  Name global;
  Type local_30;
  BasicType local_24;
  Type local_20;
  Function *local_18;
  Function *curr_local;
  Scanner *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  local_20 = Function::getParams(curr);
  local_24 = none;
  bVar1 = wasm::Type::operator==(&local_20,&local_24);
  local_79 = false;
  if (bVar1) {
    local_30 = Function::getResults(local_18);
    global.super_IString.str._M_str._4_4_ = 0;
    local_79 = wasm::Type::operator==
                         (&local_30,(BasicType *)((long)&global.super_IString.str._M_str + 4));
  }
  if (local_79 != false) {
    ___range2 = (string_view)getOnceGlobal(this,local_18->body);
    bVar1 = IString::is((IString *)&__range2);
    if (bVar1) {
      this_00 = std::
                unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::at(&this->optInfo->onceFuncs,(key_type *)local_18);
      wasm::Name::operator=(this_00,(Name *)&__range2);
      pmVar2 = std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::operator[](&this->readGlobals,(key_type *)&__range2);
      *pmVar2 = *pmVar2 - 1;
    }
  }
  __end2 = std::
           unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
           ::begin(&this->readGlobals);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
       ::end(&this->readGlobals);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true>
                            ,&local_60), bVar1) {
    __in = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
           operator*(&__end2);
    __k = std::get<0ul,wasm::Name_const,unsigned_int>(__in);
    ptVar3 = std::get<1ul,wasm::Name_const,unsigned_int>(__in);
    if (*ptVar3 != 0) {
      this_01 = std::
                unordered_map<wasm::Name,_std::atomic<bool>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>_>
                ::at(&this->optInfo->onceGlobals,__k);
      std::atomic<bool>::operator=(this_01,false);
    }
    std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    // TODO: support params and results?
    if (curr->getParams() == Type::none && curr->getResults() == Type::none) {
      auto global = getOnceGlobal(curr->body);
      if (global.is()) {
        // This is a "once" function, as best we can tell for now. Further
        // information may cause a problem, say, if the global is used in a bad
        // way in another function, so we may undo this.
        optInfo.onceFuncs.at(curr->name) = global;

        // We can ignore the get in the "once" pattern at the top of the
        // function.
        readGlobals[global]--;
      }
    }

    for (auto& [global, count] : readGlobals) {
      if (count > 0) {
        // This global has reads we cannot reason about, so do not optimize it.
        optInfo.onceGlobals.at(global) = false;
      }
    }
  }